

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

float ImNodes::GetDistanceToLineSquared(ImVec2 *point,ImVec2 *a,ImVec2 *b)

{
  float fVar1;
  float fVar2;
  float local_30;
  float u;
  float t;
  float ty;
  float tx;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImVec2 *point_local;
  
  fVar1 = b->x - a->x;
  fVar2 = b->y - a->y;
  local_30 = ((point->x - a->x) * fVar1 + (point->y - a->y) * fVar2) /
             (fVar1 * fVar1 + fVar2 * fVar2);
  if (local_30 <= 1.0) {
    if (local_30 < 0.0) {
      local_30 = 0.0;
    }
  }
  else {
    local_30 = 1.0;
  }
  fVar1 = (local_30 * fVar1 + a->x) - point->x;
  fVar2 = (local_30 * fVar2 + a->y) - point->y;
  return fVar1 * fVar1 + fVar2 * fVar2;
}

Assistant:

float GetDistanceToLineSquared(const ImVec2& point, const ImVec2& a, const ImVec2& b)
{
    float tx, ty, t, u;
    tx = b.x - a.x;
    ty = b.y - a.y;
    t = (tx * tx) + (ty * ty);
    u = ((point.x - a.x) * tx + (point.y - a.y) * ty) / t;
    if (u > 1)
        u = 1;
    else if (u < 0)
        u = 0;
    tx = (a.x + u * tx) - point.x;
    ty = (a.y + u * ty) - point.y;
    return tx * tx + ty * ty;
}